

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O3

string * __thiscall
puppup::movegen::toString_abi_cxx11_(string *__return_storage_ptr__,movegen *this,long *mov)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  const_iterator __end2;
  long lVar4;
  long *plVar5;
  ostream *poVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Rack tmp1;
  stringstream ss;
  Rack tmp2;
  long local_3b8 [26];
  long local_2e8;
  stringstream local_2b8 [16];
  ostream local_2a8 [112];
  ios_base local_238 [264];
  undefined1 auStack_130 [256];
  
  std::__cxx11::stringstream::stringstream(local_2b8);
  auVar13 = vpbroadcastq_avx512f(ZEXT816(999));
  lVar4 = 0;
  do {
    auVar14 = vmovdqu64_avx512f(auVar13);
    *(undefined1 (*) [64])(local_3b8 + lVar4) = auVar14;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  lVar4 = 0;
  do {
    auVar14 = vmovdqu64_avx512f(auVar13);
    *(undefined1 (*) [64])(auStack_130 + lVar4 * 8) = auVar14;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  lVar4 = *(long *)(this + 8);
  lVar1 = *mov;
  if (lVar4 == -1) {
    plVar7 = *(long **)(lVar1 + -0x18);
    plVar5 = *(long **)(lVar1 + -0x10);
  }
  else {
    plVar7 = *(long **)(lVar1 + lVar4 * 0x18);
    plVar5 = *(long **)(lVar1 + 8 + lVar4 * 0x18);
    if (plVar7 != plVar5) {
      lVar8 = *(long *)(this + 0x18);
      plVar9 = (long *)((long)&tmp1 +
                       *(long *)(this + 0x10) * 8 +
                       ((ulong)((long)plVar5 - (long)plVar7) >> 3) * lVar8 * -8);
      plVar11 = plVar7;
      do {
        if (*plVar9 == 0x1b) {
          lVar12 = *plVar11;
          local_3b8[lVar12] = local_3b8[lVar12] + -1;
          lVar2 = (&scores)[lVar12];
          *plVar9 = lVar12;
          plVar9[0x100] = lVar2;
        }
        plVar11 = plVar11 + 1;
        plVar9 = plVar9 + lVar8;
      } while (plVar11 != plVar5);
    }
    uVar10 = *(ulong *)(this + 0x20);
    if (uVar10 != 0) {
      do {
        local_2e8 = local_2e8 + -1;
        *(undefined8 *)(&stack0x00000808 + (uVar10 & 0xffff) * 8) = 0;
        local_3b8[tmp1._M_elems[(uVar10 & 0xffff) - 1]] =
             local_3b8[tmp1._M_elems[(uVar10 & 0xffff) - 1]] + 1;
        bVar3 = 0xffff < uVar10;
        uVar10 = (long)uVar10 >> 0x10;
      } while (bVar3);
    }
    lVar8 = 0;
    do {
      auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3b8 + lVar8));
      vpmovq2m_avx512dq(auVar13);
      auVar14 = vpaddq_avx512f(auVar13,*(undefined1 (*) [64])(auStack_130 + lVar8 * 8));
      auVar13 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])(local_3b8 + lVar8) = auVar13;
      auVar13 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])(auStack_130 + lVar8 * 8) = auVar13;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
  }
  lVar12 = *(long *)(this + 0x10) - ((long)plVar5 - (long)plVar7 >> 3) * *(long *)(this + 0x18);
  lVar8 = lVar12 + 0xf;
  if (-1 < lVar12) {
    lVar8 = lVar12;
  }
  if (*(long *)(this + 0x18) == 0x10) {
    poVar6 = std::ostream::_M_insert<long>((long)local_2a8);
    local_3b8[0]._0_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar8 >> 4];
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_3b8,1);
  }
  else {
    local_3b8[0]._0_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar8 >> 4];
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_2a8,(char *)local_3b8,1);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  plVar7 = (long *)(lVar1 + lVar4 * 0x18);
  plVar5 = (long *)*plVar7;
  plVar7 = (long *)plVar7[1];
  if (plVar5 != plVar7) {
    do {
      if (*(long *)(&stack0x00000810 + lVar12 * 8) == 0) {
        local_3b8[0]._0_1_ = "EIAONTRSULDGYWVPMHFCBZXQKJ_    +"[*plVar5];
        std::__ostream_insert<char,std::char_traits<char>>(local_2a8,(char *)local_3b8,1);
      }
      else {
        local_3b8[0]._0_1_ = "eiaontrsuldgywvpmhfcbzxqkj_    +"[*plVar5];
        std::__ostream_insert<char,std::char_traits<char>>(local_2a8,(char *)local_3b8,1);
      }
      plVar5 = plVar5 + 1;
      lVar12 = lVar12 + *(long *)(this + 0x18);
    } while (plVar5 != plVar7);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_2b8);
  std::ios_base::~ios_base(local_238);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const Move& mov, board::State state,
                            const trie::Gaddag& gaddag) {
    std::stringstream ss;
    makeMove(state, mov, gaddag);
    const auto& s = gaddag.getStringFromWord(mov.word);
    idx cursor = mov.cursor - s.size() * mov.step;
    idx x = cursor % 16 - board::board_min;
    idx y = cursor / 16 - board::board_min;
    if (mov.step == 16) {
        ss << x + 1 << ABC[y] << " ";
    } else {
        ss << ABC[y] << x + 1 << " ";
    }

    for (chr c : s) {
        if (state.letter_score[cursor] == 0) {
            ss << idxSTR[c];
        } else {
            ss << idxstr[c];
        }
        cursor += mov.step;
    }
    return ss.str();
}